

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall google::protobuf::internal::ExtensionSet::Clear(ExtensionSet *this)

{
  uint16_t uVar1;
  KeyValue *pKVar2;
  long lVar3;
  
  uVar1 = this->flat_size_;
  pKVar2 = (this->map_).flat;
  if (-1 < (long)(short)uVar1) {
    if (uVar1 != 0) {
      lVar3 = (long)(short)uVar1 << 5;
      do {
        Extension::Clear(&pKVar2->second);
        pKVar2 = (KeyValue *)(&pKVar2->second + 1);
        lVar3 = lVar3 + -0x20;
      } while (lVar3 != 0);
    }
    return;
  }
  ForEach<std::_Rb_tree_iterator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,google::protobuf::internal::ExtensionSet::Clear()::__0>
            ((pKVar2->second).descriptor,&pKVar2->second);
  return;
}

Assistant:

void ExtensionSet::Clear() {
  ForEach([](int /* number */, Extension& ext) { ext.Clear(); });
}